

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O0

size_t Q_GetLen(QMatrix *Q,size_t RoC)

{
  LASErrIdType LVar1;
  size_t local_20;
  size_t Len;
  size_t RoC_local;
  QMatrix *Q_local;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    if ((RoC == 0) || (Q->Dim < RoC)) {
      LASError(LASRangeErr,"Q_GetLen",Q->Name,(char *)0x0,(char *)0x0);
      local_20 = 0;
    }
    else {
      local_20 = Q->Len[RoC];
    }
  }
  else {
    local_20 = 0;
  }
  return local_20;
}

Assistant:

size_t Q_GetLen(QMatrix *Q, size_t RoC)
/* returns the lenght of a row or column of the matrix Q */
{
    size_t Len;

    if (LASResult() == LASOK) {
        if (RoC > 0 && RoC <= Q->Dim) {
            Len = Q->Len[RoC];
        } else {
            LASError(LASRangeErr, "Q_GetLen", Q->Name, NULL, NULL);
            Len = 0;
        }
    } else {
        Len = 0;
    }
    return(Len);
}